

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

int __thiscall asmjit::v1_14::CodeHolder::init(CodeHolder *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int extraout_EAX;
  int iVar5;
  Error EVar6;
  Error EVar7;
  void *pvVar8;
  uint64_t in_RCX;
  undefined8 *in_RDX;
  uint uVar9;
  BaseEmitter *emitter;
  BaseEmitter *pBVar10;
  CodeHolder *pCVar11;
  CodeHolder *this_00;
  ulong uVar12;
  size_t local_38;
  
  uVar9 = 6;
  if ((this->_environment)._arch != kUnknown) {
    return 6;
  }
  if (*(int *)&this->field_0xd0 != 0) {
    init((EVP_PKEY_CTX *)this);
    goto LAB_001186e5;
  }
  this_00 = (CodeHolder *)&this->_allocator;
  EVar7 = 0;
  EVar6 = 0;
  pCVar11 = this;
  if (*(int *)&this->field_0xe4 == *(int *)&this->field_0xe0) {
    pCVar11 = (CodeHolder *)&this->_sections;
    EVar6 = ZoneVectorBase::_grow((ZoneVectorBase *)pCVar11,(ZoneAllocator *)this_00,8,1);
  }
  if (*(int *)&this->field_0xf4 == *(int *)&this->field_0xf0) {
    pCVar11 = (CodeHolder *)&this->_sectionsByOrder;
    EVar7 = ZoneVectorBase::_grow((ZoneVectorBase *)pCVar11,(ZoneAllocator *)this_00,8,1);
  }
  uVar9 = EVar7 | EVar6;
  if (uVar9 == 0) {
    if (*(long *)&((ZoneAllocator *)this_00)->field_0x0 == 0) {
      init((EVP_PKEY_CTX *)pCVar11);
    }
    else {
      pBVar10 = (BaseEmitter *)0x68;
      pvVar8 = ZoneAllocator::_allocZeroed((ZoneAllocator *)this_00,0x68,&local_38);
      if (pvVar8 != (void *)0x0) {
        *(undefined4 *)((long)pvVar8 + 4) = 3;
        *(undefined8 *)((long)pvVar8 + 0x20) = 0x747865742e;
        if (*(uint *)&this->field_0xe4 <= *(uint *)&this->field_0xe0) {
          init((EVP_PKEY_CTX *)this_00);
LAB_00118706:
          init((EVP_PKEY_CTX *)this_00);
          uVar12 = (ulong)*(uint *)&this_00->field_0xd0;
          emitter = pBVar10;
          pCVar11 = this_00;
          while (uVar12 != 0) {
            uVar12 = uVar12 - 1;
            if (*(uint *)&this_00->field_0xd0 <= uVar12) {
              CodeHolder_resetInternal();
              goto LAB_0011856a;
            }
            emitter = *(BaseEmitter **)(*(long *)&this_00->_emitters + uVar12 * 8);
            pCVar11 = this_00;
            detach(this_00,emitter);
          }
          *(undefined8 *)&this_00->field_0x10 = 0;
          *(undefined8 *)&this_00->field_0x18 = 0;
          (this_00->_environment)._arch = kUnknown;
          (this_00->_environment)._subArch = kHost;
          (this_00->_environment)._vendor = kHost;
          (this_00->_environment)._platform = kUnknown;
          (this_00->_environment)._platformABI = kUnknown;
          (this_00->_environment)._objectFormat = kUnknown;
          (this_00->_environment)._floatABI = kHardFloat;
          (this_00->_environment)._reserved = '\0';
          *(undefined8 *)&this_00->_cpuFeatures = 0;
          *(undefined8 *)&this_00->field_0x20 = 0;
          this_00->_baseAddress = 0xffffffffffffffff;
          this_00->_logger = (Logger *)0x0;
          this_00->_errorHandler = (ErrorHandler *)0x0;
          uVar9 = *(uint *)&this_00->field_0xe0;
          if ((ulong)uVar9 != 0) {
            uVar12 = 0;
            do {
              if (*(uint *)&this_00->field_0xe0 <= uVar12) {
LAB_0011856a:
                CodeHolder_resetInternal();
                iVar5 = init(pCVar11,(EVP_PKEY_CTX *)emitter);
                return iVar5;
              }
              lVar1 = *(long *)(*(long *)&this_00->_sections + uVar12 * 8);
              pCVar11 = *(CodeHolder **)(lVar1 + 0x48);
              if ((pCVar11 != (CodeHolder *)0x0) && ((*(byte *)(lVar1 + 0x60) & 1) == 0)) {
                free(pCVar11);
              }
              *(undefined8 *)(lVar1 + 0x48) = 0;
              *(undefined8 *)(lVar1 + 0x58) = 0;
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
          }
          *(undefined8 *)&this_00->_emitters = 0;
          *(undefined8 *)&this_00->field_0xd0 = 0;
          *(undefined1 **)&this_00->_namedLabels = &this_00->field_0x138;
          *(undefined8 *)&this_00->field_0x120 = 0;
          *(undefined8 *)&this_00->field_0x128 = 0x100000001;
          *(undefined4 *)&this_00->field_0x130 = 1;
          *(undefined2 *)&this_00->field_0x134 = 0;
          *(undefined8 *)&this_00->_relocations = 0;
          *(undefined8 *)&this_00->field_0x110 = 0;
          *(undefined8 *)&this_00->_labelEntries = 0;
          *(undefined8 *)&this_00->field_0x100 = 0;
          *(undefined8 *)&this_00->_sectionsByOrder = 0;
          *(undefined8 *)&this_00->field_0xf0 = 0;
          *(undefined8 *)&this_00->_sections = 0;
          *(undefined8 *)&this_00->field_0xe0 = 0;
          this_00->_addressTableSection = (Section *)0x0;
          *(undefined8 *)&this_00->_addressTableEntries = 0;
          *(undefined8 *)&this_00->field_0x138 = 0;
          this_00->_unresolvedLinkCount = 0;
          ZoneAllocator::reset(&this_00->_allocator,&this_00->_zone);
          Zone::reset(&this_00->_zone,(ResetPolicy)pBVar10);
          return extraout_EAX;
        }
        *(void **)(*(long *)&this->_sections + (ulong)*(uint *)&this->field_0xe0 * 8) = pvVar8;
        *(int *)&this->field_0xe0 = *(int *)&this->field_0xe0 + 1;
        if (*(uint *)&this->field_0xf4 <= *(uint *)&this->field_0xf0) goto LAB_00118706;
        *(void **)(*(long *)&this->_sectionsByOrder + (ulong)*(uint *)&this->field_0xf0 * 8) =
             pvVar8;
        *(int *)&this->field_0xf0 = *(int *)&this->field_0xf0 + 1;
        uVar9 = 0;
        goto LAB_001186a8;
      }
    }
    uVar9 = 1;
  }
LAB_001186a8:
  if (uVar9 == 0) {
    this->_environment = *(Environment *)ctx;
    uVar2 = in_RDX[1];
    uVar3 = in_RDX[2];
    uVar4 = in_RDX[3];
    *(undefined8 *)&this->_cpuFeatures = *in_RDX;
    *(undefined8 *)&this->field_0x10 = uVar2;
    *(undefined8 *)&this->field_0x18 = uVar3;
    *(undefined8 *)&this->field_0x20 = uVar4;
    this->_baseAddress = in_RCX;
    return 0;
  }
LAB_001186e5:
  Zone::reset(&this->_zone,kSoft);
  return uVar9;
}

Assistant:

Error CodeHolder::init(const Environment& environment, const CpuFeatures& cpuFeatures, uint64_t baseAddress) noexcept {
  // Cannot reinitialize if it's locked or there is one or more emitter attached.
  if (isInitialized())
    return DebugUtils::errored(kErrorAlreadyInitialized);

  // If we are just initializing there should be no emitters attached.
  ASMJIT_ASSERT(_emitters.empty());

  // Create a default section and insert it to the `_sections` array.
  Error err = _sections.willGrow(&_allocator) |
              _sectionsByOrder.willGrow(&_allocator);
  if (err == kErrorOk) {
    Section* section = _allocator.allocZeroedT<Section>();
    if (ASMJIT_LIKELY(section)) {
      section->_flags = SectionFlags::kExecutable | SectionFlags::kReadOnly;
      CodeHolder_setSectionDefaultName(section, '.', 't', 'e', 'x', 't');
      _sections.appendUnsafe(section);
      _sectionsByOrder.appendUnsafe(section);
    }
    else {
      err = DebugUtils::errored(kErrorOutOfMemory);
    }
  }

  if (ASMJIT_UNLIKELY(err)) {
    _zone.reset();
    return err;
  }
  else {
    _environment = environment;
    _cpuFeatures = cpuFeatures;
    _baseAddress = baseAddress;
    return kErrorOk;
  }
}